

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IndexType.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,IndexType *it)

{
  ostream *poVar1;
  ulong uVar2;
  uint *in_RSI;
  ostream *in_RDI;
  char local_79;
  uint uVar3;
  undefined2 in_stack_ffffffffffffff94;
  undefined1 uVar4;
  char cVar5;
  char local_59;
  
  poVar1 = std::operator<<(in_RDI,'(');
  local_59 = 'N';
  if ((*in_RSI & 1) == 0) {
    local_59 = 'C';
  }
  poVar1 = std::operator<<(poVar1,local_59);
  poVar1 = std::operator<<(poVar1,',');
  uVar3 = *in_RSI;
  uVar4 = 0x43;
  cVar5 = 'N';
  if ((uVar3 & 2) == 0) {
    cVar5 = 'C';
  }
  poVar1 = std::operator<<(poVar1,cVar5);
  poVar1 = std::operator<<(poVar1,',');
  local_79 = 'N';
  if ((*in_RSI & 4) == 0) {
    local_79 = 'C';
  }
  poVar1 = std::operator<<(poVar1,local_79);
  poVar1 = std::operator<<(poVar1,')');
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  uVar2 = std::ios::fail();
  if ((uVar2 & 1) != 0) {
    Error_host((char *)CONCAT17(cVar5,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff94,uVar3))));
  }
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream&    os,
            const IndexType& it)
{
    os << '('
       << AMREX_D_TERM( (it.test(0)?'N':'C'),
                  << ',' << (it.test(1)?'N':'C'),
                  << ',' << (it.test(2)?'N':'C')) << ')' << std::flush;

    if (os.fail())
        amrex::Error("operator<<(ostream&,IndexType&) failed");

    return os;
}